

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O2

void __thiscall cs::statement_catch::~statement_catch(statement_catch *this)

{
  std::__cxx11::string::~string((string *)&this->mName);
  statement_base::~statement_base(&this->super_statement_base);
  return;
}

Assistant:

statement_catch() = delete;